

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  _Bool _Var1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  _Bool has_value;
  uint16_t low16;
  uint32_t consumed;
  uint32_t ret;
  uint32_t in_stack_00000034;
  roaring_container_iterator_t *in_stack_00000038;
  uint8_t in_stack_00000047;
  container_t *in_stack_00000048;
  uint32_t *in_stack_00000060;
  uint16_t *in_stack_00000068;
  roaring_uint32_iterator_t *newit;
  ushort local_26;
  uint local_24;
  uint32_t local_20;
  uint local_1c;
  long local_18;
  long local_10;
  
  local_20 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if ((*(byte *)(local_10 + 0x24) & 1) == 0 || local_1c <= local_20) {
      return local_20;
    }
    local_26 = (ushort)*(undefined4 *)(local_10 + 0x20);
    newit = (roaring_uint32_iterator_t *)&stack0xffffffffffffffda;
    _Var1 = container_iterator_read_into_uint32
                      (in_stack_00000048,in_stack_00000047,in_stack_00000038,in_stack_00000034,
                       (uint32_t *)it,buf._4_4_,in_stack_00000060,in_stack_00000068);
    local_20 = local_24 + local_20;
    local_18 = local_18 + (ulong)local_24 * 4;
    if (_Var1) break;
    *(int *)(local_10 + 0x14) = *(int *)(local_10 + 0x14) + 1;
    _Var1 = loadfirstvalue(newit);
    *(_Bool *)(local_10 + 0x24) = _Var1;
  }
  *(undefined1 *)(local_10 + 0x24) = 1;
  *(uint *)(local_10 + 0x20) = *(uint *)(local_10 + 0x18) | (uint)local_26;
  return local_20;
}

Assistant:

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,
                                      uint32_t *buf, uint32_t count) {
    uint32_t ret = 0;
    while (it->has_value && ret < count) {
        uint32_t consumed;
        uint16_t low16 = (uint16_t)it->current_value;
        bool has_value = container_iterator_read_into_uint32(
            it->container, it->typecode, &it->container_it, it->highbits, buf,
            count - ret, &consumed, &low16);
        ret += consumed;
        buf += consumed;
        if (has_value) {
            it->has_value = true;
            it->current_value = it->highbits | low16;
            assert(ret == count);
            return ret;
        }
        it->container_index++;
        it->has_value = loadfirstvalue(it);
    }
    return ret;
}